

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_connection::incoming_suggest(peer_connection *this,piece_index_t index)

{
  vector<piece_index_t> *this_00;
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  torrent *this_02;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> _Var2;
  pointer psVar3;
  pointer psVar4;
  session_settings *psVar5;
  char cVar6;
  _Atomic_word _Var7;
  int iVar8;
  char *fmt;
  char *event;
  direction_t direction;
  ulong uVar9;
  _List_node_base *p_Var10;
  bool bVar11;
  value_type local_44;
  unique_lock<std::mutex> local_40;
  
  local_44.m_val = index.m_val;
  peer_log(this,incoming_message,"SUGGEST_PIECE","piece: %d",(ulong)(uint)index.m_val);
  this_01 = (this->super_peer_connection_hot_members).m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var7 = this_01->_M_use_count;
    do {
      if (_Var7 == 0) {
        return;
      }
      LOCK();
      iVar8 = this_01->_M_use_count;
      bVar11 = _Var7 == iVar8;
      if (bVar11) {
        this_01->_M_use_count = _Var7 + 1;
        iVar8 = _Var7;
      }
      _Var7 = iVar8;
      UNLOCK();
    } while (!bVar11);
    this_02 = (this->super_peer_connection_hot_members).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_02 != (torrent *)0x0 && this_01->_M_use_count != 0) {
      p_Var10 = (_List_node_base *)&this->m_extensions;
      do {
        p_Var10 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                     *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var10 == (_List_node_base *)&this->m_extensions) {
          iVar8 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
          if ((char)iVar8 != '\0') break;
          if (local_44.m_val < 0) {
            peer_log(this,incoming_message,"INVALID_SUGGEST_PIECE","%d");
            break;
          }
          if ((((this_02->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files).m_piece_length < 1) {
LAB_0023f4d3:
            psVar3 = (this->m_suggested_pieces).
                     super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     .
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            psVar4 = (this->m_suggested_pieces).
                     super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     .
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            psVar5 = (this->super_peer_connection_hot_members).m_settings;
            local_40._M_device = &psVar5->m_mutex;
            local_40._M_owns = false;
            ::std::unique_lock<std::mutex>::lock(&local_40);
            this_00 = &this->m_suggested_pieces;
            local_40._M_owns = true;
            iVar8 = (psVar5->m_store).m_ints._M_elems[0x42];
            ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
            if (iVar8 < (int)((ulong)((long)psVar3 - (long)psVar4) >> 2)) {
              psVar5 = (this->super_peer_connection_hot_members).m_settings;
              local_40._M_device = &psVar5->m_mutex;
              local_40._M_owns = false;
              ::std::unique_lock<std::mutex>::lock(&local_40);
              local_40._M_owns = true;
              iVar8 = (psVar5->m_store).m_ints._M_elems[0x42];
              ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
              ::std::
              vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ::resize(&this_00->
                        super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       ,(long)iVar8 - 1);
            }
            ::std::
            vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
            ::insert(&this_00->
                      super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     ,(this_00->
                      super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                      ).
                      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&local_44);
            uVar9 = (ulong)((long)(this->m_suggested_pieces).
                                  super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                  .
                                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_suggested_pieces).
                                 super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                 .
                                 super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 2;
            event = "SUGGEST_PIECE";
            fmt = "piece: %d added to set: %d";
            direction = info;
          }
          else {
            _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                 (this->super_peer_connection_hot_members).m_have_piece.super_bitfield.m_buf.
                 super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t;
            if ((_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
                _Var2._M_t.
                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
              uVar9 = 0;
            }
            else {
              uVar1 = *(uint *)_Var2._M_t.
                               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                               .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
              uVar9 = (ulong)uVar1;
              if (local_44.m_val < (int)uVar1) {
                bVar11 = torrent::have_piece(this_02,(piece_index_t)local_44.m_val);
                if (!bVar11) goto LAB_0023f4d3;
                break;
              }
            }
            event = "INVALID_SUGGEST";
            fmt = "%d s: %d";
            direction = incoming_message;
          }
          peer_log(this,direction,event,fmt,(ulong)(uint)local_44.m_val,uVar9);
          break;
        }
        cVar6 = (**(code **)(*(long *)p_Var10[1]._M_next + 0xb0))();
      } while (cVar6 == '\0');
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void peer_connection::incoming_suggest(piece_index_t const index)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming_message, "SUGGEST_PIECE"
			, "piece: %d", static_cast<int>(index));
#endif
		auto t = m_torrent.lock();
		if (!t) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_suggest(index)) return;
		}
#endif

		if (is_disconnecting()) return;
		if (index < piece_index_t(0))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "INVALID_SUGGEST_PIECE"
				, "%d", static_cast<int>(index));
#endif
			return;
		}

		if (t->valid_metadata())
		{
			if (index >= m_have_piece.end_index())
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "INVALID_SUGGEST"
					, "%d s: %d", static_cast<int>(index), m_have_piece.size());
#endif
				return;
			}

			// if we already have the piece, we can
			// ignore this message
			if (t->have_piece(index))
				return;
		}

		// the piece picker will prioritize the pieces from the beginning to end.
		// the later the suggestion is received, the higher priority we should
		// ascribe to it, so we need to insert suggestions at the front of the
		// queue.
		if (m_suggested_pieces.end_index() > m_settings.get_int(settings_pack::max_suggest_pieces))
			m_suggested_pieces.resize(m_settings.get_int(settings_pack::max_suggest_pieces) - 1);

		m_suggested_pieces.insert(m_suggested_pieces.begin(), index);

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::info, "SUGGEST_PIECE", "piece: %d added to set: %d"
			, static_cast<int>(index), m_suggested_pieces.end_index());
#endif
	}